

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

StringRef llvm::dwarf::DefaultedMemberString(uint DefaultedEncodings)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SVar3;
  
  pcVar1 = (char *)0x0;
  sVar2 = 0;
  if (DefaultedEncodings < 3) {
    pcVar1 = &DAT_00e75938 + *(int *)(&DAT_00e75938 + (ulong)DefaultedEncodings * 4);
    sVar2 = *(size_t *)(&DAT_00e75948 + (ulong)DefaultedEncodings * 8);
  }
  SVar3.Length = sVar2;
  SVar3.Data = pcVar1;
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::DefaultedMemberString(unsigned DefaultedEncodings) {
  switch (DefaultedEncodings) {
  // Defaulted Member Encodings codes
  case DW_DEFAULTED_no:
    return "DW_DEFAULTED_no";
  case DW_DEFAULTED_in_class:
    return "DW_DEFAULTED_in_class";
  case DW_DEFAULTED_out_of_class:
    return "DW_DEFAULTED_out_of_class";
  }
  return StringRef();
}